

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvector.cc
# Opt level: O0

DVector * __thiscall fizplex::DVector::operator-=(DVector *this,DVector *rhs)

{
  size_t *psVar1;
  double *pdVar2;
  DVector *in_RDI;
  size_t i;
  DVector *in_stack_ffffffffffffffd0;
  double dVar3;
  DVector *this_00;
  ulong local_18;
  
  this_00 = (DVector *)in_RDI->dim;
  psVar1 = dimension(in_stack_ffffffffffffffd0);
  if (this_00 == (DVector *)*psVar1) {
    for (local_18 = 0; local_18 < in_RDI->dim; local_18 = local_18 + 1) {
      pdVar2 = operator[](this_00,(size_t)in_RDI);
      dVar3 = *pdVar2;
      pdVar2 = std::valarray<double>::operator[](&in_RDI->vals,local_18);
      *pdVar2 = *pdVar2 - dVar3;
    }
    return in_RDI;
  }
  __assert_fail("dim == rhs.dimension()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/dvector.cc"
                ,0x5f,"DVector &fizplex::DVector::operator-=(const DVector &)");
}

Assistant:

DVector &DVector::operator-=(const DVector &rhs) {
  assert(dim == rhs.dimension());
  for (size_t i = 0; i < dim; i++)
    vals[i] -= rhs[i];
  return *this;
}